

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

bool helics::BrokerFactory::registerBroker(shared_ptr<helics::Broker> *broker,CoreType type)

{
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  int *piVar5;
  shared_ptr<helics::Broker> local_88;
  shared_ptr<helics::Broker> local_78;
  shared_ptr<helics::Broker> local_68;
  string local_58;
  timespec local_38;
  
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
  }
  else {
    iVar4 = (*peVar1->_vptr_Broker[0xb])();
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
    peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      bVar3 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addObject
                        ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)
                         searchableBrokers,&local_58,&local_68,type);
      if (local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0 && !bVar3) {
        local_38.tv_sec = 0;
        local_38.tv_nsec = 100000000;
        do {
          iVar4 = nanosleep(&local_38,&local_38);
          if (iVar4 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects
                  ((DelayedDestructor<helics::Broker> *)delayedDestroyer,(milliseconds)0xc8);
        local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar3 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::
                addObject((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)
                          searchableBrokers,&local_58,&local_78,type);
        if (local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (bVar3 != false) {
        local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        gmlc::concurrency::DelayedDestructor<helics::Broker>::addObjectsToBeDestroyed
                  ((DelayedDestructor<helics::Broker> *)delayedDestroyer,&local_88);
        if (local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        bVar3 = true;
        addExtraTypes(&local_58,type);
        goto LAB_002dbbb3;
      }
    }
  }
  bVar3 = false;
LAB_002dbbb3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool registerBroker(const std::shared_ptr<Broker>& broker, CoreType type)
{
    bool registered = false;
    const std::string& bname = (broker) ? broker->getIdentifier() : std::string{};
    if (broker) {
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if ((!registered) && (broker)) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        cleanUpBrokers(std::chrono::milliseconds(200));
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if (registered) {
        delayedDestroyer.addObjectsToBeDestroyed(broker);
        addExtraTypes(bname, type);
    }

    return registered;
}